

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

event_config * event_config_new(void)

{
  event_config *peVar1;
  
  peVar1 = (event_config *)event_mm_calloc_(1,0x38);
  if (peVar1 == (event_config *)0x0) {
    peVar1 = (event_config *)0x0;
  }
  else {
    (peVar1->entries).tqh_first = (event_config_entry *)0x0;
    (peVar1->entries).tqh_last = (event_config_entry **)peVar1;
    (peVar1->max_dispatch_interval).tv_sec = -1;
    peVar1->max_dispatch_callbacks = 0x7fffffff;
    peVar1->limit_callbacks_after_prio = 1;
  }
  return peVar1;
}

Assistant:

struct event_config *
event_config_new(void)
{
	struct event_config *cfg = mm_calloc(1, sizeof(*cfg));

	if (cfg == NULL)
		return (NULL);

	TAILQ_INIT(&cfg->entries);
	cfg->max_dispatch_interval.tv_sec = -1;
	cfg->max_dispatch_callbacks = INT_MAX;
	cfg->limit_callbacks_after_prio = 1;

	return (cfg);
}